

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile
          (TiledInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  byte bVar1;
  TileOffsets *this_00;
  _func_int *p_Var2;
  undefined8 uVar3;
  undefined4 in_ECX;
  long *in_RDX;
  GenericInputFile *in_RDI;
  undefined4 in_R8D;
  TiledInputFile *in_stack_00000010;
  size_t i;
  InputStreamMutex *in_stack_ffffffffffffff80;
  undefined2 uVar4;
  IStream *is_00;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__TiledInputFile_0374bb48;
  is_00 = (IStream *)(in_RDI + 1);
  this_00 = (TileOffsets *)operator_new(0x180);
  Data::Data((Data *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffdc);
  is_00->_vptr_IStream = (_func_int **)this_00;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x2f) = 0;
  p_Var2 = (_func_int *)operator_new(0x38);
  InputStreamMutex::InputStreamMutex(in_stack_ffffffffffffff80);
  in_RDI[1]._vptr_GenericInputFile[0x2e] = p_Var2;
  *(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) = in_RDX;
  Header::operator=((Header *)CONCAT44(in_ECX,in_R8D),
                    (Header *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar4 = (undefined2)((ulong)p_Var2 >> 0x30);
  *(undefined4 *)(in_RDI[1]._vptr_GenericInputFile + 0xe) = in_ECX;
  initialize(in_stack_00000010);
  TileOffsets::readFrom(this_00,is_00,(bool *)in_RDI,SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
  bVar1 = (**(code **)(*in_RDX + 0x10))();
  *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x2d) = bVar1 & 1;
  uVar3 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) + 0x28))();
  *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x30) = uVar3;
  return;
}

Assistant:

TiledInputFile::TiledInputFile (const Header &header,
                                OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
                                int version,
                                int numThreads) :
    _data (new Data (numThreads))
{
    _data->_deleteStream=false;
    _data->_streamData = new InputStreamMutex();
    //
    // This constructor called by class Imf::InputFile
    // when a user wants to just read an image file, and
    // doesn't care or know if the file is tiled.
    // No need to have backward compatibility here, because
    // we have somehow got the header.
    //

    try
    {
        _data->_streamData->is = is;
        _data->header = header;
        _data->version = version;
        initialize();
        _data->tileOffsets.readFrom (*(_data->_streamData->is),_data->fileIsComplete,false,false);
        _data->memoryMapped = is->isMemoryMapped();
        _data->_streamData->currentPosition = _data->_streamData->is->tellg();
    }
    catch(...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                     delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        delete _data->_streamData;
        delete _data;
        throw; 
    }
}